

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O3

bool __thiscall cs::token_id::dump(token_id *this,ostream *o)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< ID = \"",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->mId).m_id._M_dataplus._M_p,(this->mId).m_id._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" >",3);
  return true;
}

Assistant:

bool dump(std::ostream &o) const override
		{
			o << "< ID = \"" << mId.get_id() << "\" >";
			return true;
		}